

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphicsplugin_opengl.cpp
# Opt level: O2

shared_ptr<IGraphicsPlugin>
CreateGraphicsPlugin_OpenGL
          (shared_ptr<Options> *options,shared_ptr<IPlatformPlugin> *platformPlugin)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<IGraphicsPlugin> sVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var3;
  __allocator_type __a2;
  allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::OpenGLGraphicsPlugin,_std::allocator<(anonymous_namespace)::OpenGLGraphicsPlugin>,_(__gnu_cxx::_Lock_policy)2>_>
  local_51;
  undefined8 local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::OpenGLGraphicsPlugin,_std::allocator<(anonymous_namespace)::OpenGLGraphicsPlugin>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_40;
  
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x2f0);
  local_40._M_alloc = &local_51;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00125940;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__OpenGLGraphicsPlugin_00125990;
  memset(&p_Var1[1]._M_use_count,0,0x9f);
  memset(&p_Var1[0xb]._M_use_count,0,0x154);
  p_Var1[0x21]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[0x21]._M_use_count = 0;
  p_Var1[0x21]._M_weak_count = 0;
  p_Var1[0x22]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[0x22]._M_use_count = 0;
  p_Var1[0x22]._M_weak_count = 0;
  *(undefined8 *)&p_Var1[0x22]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var1[0x23]._vptr__Sp_counted_base + 4) = 0;
  *(undefined4 *)&p_Var1[0x24]._vptr__Sp_counted_base = 0x3b9b23d9;
  p_Var1[0x24]._M_use_count = 0;
  p_Var1[0x24]._M_weak_count = 0;
  p_Var1[0x25]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[0x25]._M_use_count = 0;
  p_Var1[0x26]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[0x26]._M_use_count = 0;
  p_Var1[0x26]._M_weak_count = 0;
  p_Var1[0x27]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[0x28]._vptr__Sp_counted_base = (_func_int **)&p_Var1[0x27]._M_use_count;
  *(_Atomic_word **)&p_Var1[0x27]._M_use_count = &p_Var1[0x27]._M_use_count;
  p_Var1[0x2b]._M_use_count = 0;
  p_Var1[0x2c]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[0x2a]._M_use_count = 0;
  p_Var1[0x2a]._M_weak_count = 0;
  p_Var1[0x28]._M_use_count = 0;
  p_Var1[0x28]._M_weak_count = 0;
  p_Var1[0x29]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[0x29]._M_use_count = 0;
  p_Var1[0x29]._M_weak_count = 0;
  p_Var1[0x2a]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(_Atomic_word **)&p_Var1[0x2c]._M_use_count = &p_Var1[0x2b]._M_use_count;
  p_Var1[0x2d]._vptr__Sp_counted_base = (_func_int **)&p_Var1[0x2b]._M_use_count;
  p_Var1[0x2d]._M_use_count = 0;
  p_Var1[0x2d]._M_weak_count = 0;
  _Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
          Options::GetBackgroundClearColor
                    ((Options *)
                     (platformPlugin->
                     super___shared_ptr<IPlatformPlugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  p_Var1[0x2e] = _Var3;
  local_40._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::OpenGLGraphicsPlugin,_std::allocator<(anonymous_namespace)::OpenGLGraphicsPlugin>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_40);
  (options->super___shared_ptr<Options,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)(p_Var1 + 1);
  local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (options->super___shared_ptr<Options,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var1;
  local_50 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  sVar2.super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)options;
  return (shared_ptr<IGraphicsPlugin>)
         sVar2.super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<IGraphicsPlugin> CreateGraphicsPlugin_OpenGL(const std::shared_ptr<Options>& options,
                                                             std::shared_ptr<IPlatformPlugin> platformPlugin) {
    return std::make_shared<OpenGLGraphicsPlugin>(options, platformPlugin);
}